

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef fori_arg(jit_State *J,BCIns *fori,BCReg slot,IRType t,int mode)

{
  TRef local_28;
  TRef tr;
  int mode_local;
  IRType t_local;
  BCReg slot_local;
  BCIns *fori_local;
  jit_State *J_local;
  
  local_28 = J->base[slot];
  if ((local_28 == 0) && (local_28 = find_kinit(J,fori,slot,t), local_28 == 0)) {
    local_28 = fori_load(J,slot,t,mode);
  }
  return local_28;
}

Assistant:

static TRef fori_arg(jit_State *J, const BCIns *fori, BCReg slot,
		     IRType t, int mode)
{
  TRef tr = J->base[slot];
  if (!tr) {
    tr = find_kinit(J, fori, slot, t);
    if (!tr)
      tr = fori_load(J, slot, t, mode);
  }
  return tr;
}